

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void testBase32(void)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  size_t j;
  size_t sVar5;
  C *pCVar6;
  size_t count;
  Array<char,_axl::sl::ArrayDetails<char>_> dec;
  String enc;
  Array<char,_axl::sl::ArrayDetails<char>_> source;
  String enc_1;
  Array<char,_axl::sl::ArrayDetails<char>_> dec_1;
  char s [81];
  
  pcVar3 = "NB2WSLBAM5XXM3TPEBUSA3LVOJQXMZLJFQQG25LSMF3GK2JMEBTW65TON4QGSIDIOVUSCIJBEE======";
  pCVar6 = s;
  for (lVar4 = 0x51; lVar4 != 0; lVar4 = lVar4 + -1) {
    *pCVar6 = *pcVar3;
    pcVar3 = pcVar3 + 1;
    pCVar6 = pCVar6 + 1;
  }
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
            (&enc.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>,s);
  axl::enc::Base32Encoding::decode
            (&dec,&enc.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
            (&enc.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
  axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::append(&dec,'\0',1);
  printf("decoded: %s\n",dec.super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_p);
  axl::enc::Base32Encoding::encode
            (&enc,dec.super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_p,
             dec.super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_count - 1,0);
  if (enc.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_length == 0) {
    enc.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_p =
         &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
  }
  printf("encoded: %s\n",enc.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_p);
  printf("orginal: %s\n",s);
  source.super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_count = 0;
  source.super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_p = (char *)0x0;
  source.super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_hdr = (Hdr *)0x0;
  for (iVar1 = 0; iVar1 != 500; iVar1 = iVar1 + 1) {
    iVar2 = rand();
    count = (size_t)(iVar2 % 0x40 + 0x10);
    axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::
    setCountImpl<axl::sl::SimpleArrayDetails<char>::Construct>(&source,count);
    pcVar3 = axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::p(&source);
    for (sVar5 = 0; count != sVar5; sVar5 = sVar5 + 1) {
      iVar2 = rand();
      pcVar3[sVar5] = (char)iVar2;
    }
    axl::enc::Base32Encoding::encode
              ((String *)&enc_1.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>,
               source.super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_p,count,0);
    axl::enc::Base32Encoding::decode
              ((Array<char,_axl::sl::ArrayDetails<char>_> *)
               &dec_1.super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>,
               &enc_1.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
    axl::sl::ArrayRef<char,_axl::sl::ArrayDetails<char>_>::~ArrayRef
              (&dec_1.super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>);
    axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
              (&enc_1.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
  }
  axl::sl::ArrayRef<char,_axl::sl::ArrayDetails<char>_>::~ArrayRef
            (&source.super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
            (&enc.super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
  axl::sl::ArrayRef<char,_axl::sl::ArrayDetails<char>_>::~ArrayRef
            (&dec.super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>);
  return;
}

Assistant:

void
testBase32() {
	char s[] = "NB2WSLBAM5XXM3TPEBUSA3LVOJQXMZLJFQQG25LSMF3GK2JMEBTW65TON4QGSIDIOVUSCIJBEE======";

	sl::Array<char> dec = enc::Base32Encoding::decode(s);
	dec.append(0);
	printf("decoded: %s\n", dec.cp());

	sl::String enc = enc::Base32Encoding::encode(dec, dec.getCount() - 1);
	printf("encoded: %s\n", enc.sz());
	printf("orginal: %s\n", s);
	ASSERT(enc == s);

	sl::Array<char> source;


	for (int i = 0; i < 500; i++) {
		size_t size = rand() % 64 + 16;
		source.setCount(size);
		sl::Array<char>::Rwi rwi = source;

		for (size_t j = 0; j < size; j++)
			rwi[j] = (char)rand();

		sl::String enc = enc::Base32Encoding::encode(source, size);
		sl::Array<char> dec = enc::Base32Encoding::decode(enc);
		ASSERT(dec.getCount() == size && memcmp(dec, source, size) == 0);
	}
}